

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::addDereferencedUniform
          (TReflectionTraverser *this,TIntermBinary *topNode)

{
  undefined4 arraySize_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  TOperator TVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TType *pTVar8;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar9;
  undefined4 extraout_var_11;
  TIntermConstantUnion *this_00;
  TConstUnionArray *this_01;
  TConstUnion *this_02;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  pair<std::_Rb_tree_const_iterator<const_TIntermNode_*>,_bool> pVar10;
  iterator local_150;
  const_iterator local_148;
  undefined1 local_140 [8];
  TString baseName;
  int arraySize;
  TIntermSymbol *local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  value_type local_e8;
  value_type local_e0;
  TIntermBinary *visitNode;
  TList<glslang::TIntermBinary_*> derefs;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  TList<glslang::TIntermBinary_*> derefs_1;
  TString baseName_1;
  TString *blockName;
  int local_50;
  bool block;
  int iStack_4c;
  bool anonymous;
  int blockIndex;
  int offset;
  TType *local_40;
  _Self local_38;
  TIntermSymbol *local_30;
  TIntermSymbol *base;
  TType *leftType;
  TIntermBinary *topNode_local;
  TReflectionTraverser *this_local;
  
  leftType = (TType *)topNode;
  topNode_local = (TIntermBinary *)this;
  iVar2 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  base = (TIntermSymbol *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))();
  uVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1b])();
  if (((((uVar3 & 1) == 0) &&
       (uVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1c])(),
       (uVar3 & 1) == 0)) ||
      (uVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(),
      (uVar3 & 1) != 0)) &&
     (local_30 = findBase(this,(TIntermBinary *)leftType), local_30 != (TIntermSymbol *)0x0)) {
    iVar2 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
    bVar1 = TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      local_40 = leftType;
      local_38._M_node =
           (_Base_ptr)
           std::
           set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
           ::find(&this->processedDerefs,(key_type *)&local_40);
      _blockIndex = std::
                    set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
                    ::end(&this->processedDerefs);
      bVar1 = std::operator!=(&local_38,(_Self *)&blockIndex);
      if (!bVar1) {
        iStack_4c = -1;
        local_50 = -1;
        blockName._7_1_ = false;
        iVar2 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
        if (iVar2 == 0x10) {
          iStack_4c = 0;
          iVar4 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
          blockName._7_1_ = IsAnonymous((TString *)CONCAT44(extraout_var_01,iVar4));
          iVar4 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x28))();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )&derefs_1.
                         super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                         .
                         super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                         ._M_impl._M_node._M_size);
          if (!blockName._7_1_) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&derefs_1.
                            super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                            .
                            super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                            ._M_impl._M_node._M_size,pbVar7);
          }
          iVar4 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          iVar5 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          iVar5 = TIntermediate::getBlockSize((TType *)CONCAT44(extraout_var_04,iVar5));
          local_50 = addBlockName(this,pbVar7,(TType *)CONCAT44(extraout_var_03,iVar4),iVar5);
          if ((this->reflection->options & EShReflectionAllBlockVariables) != EShReflectionDefault)
          {
            TList<glslang::TIntermBinary_*>::TList((TList<glslang::TIntermBinary_*> *)local_a8);
            iVar4 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
            derefs.
            super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
            .
            super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
            ._M_impl._M_node._M_size =
                 (size_t)std::__cxx11::
                         list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                         ::end((list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                                *)local_a8);
            std::_List_const_iterator<glslang::TIntermBinary_*>::_List_const_iterator
                      (&local_b0,
                       (iterator *)
                       &derefs.
                        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        .
                        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        ._M_impl._M_node._M_size);
            iVar5 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
            blowUpActiveAggregate
                      (this,(TType *)CONCAT44(extraout_var_05,iVar4),
                       (TString *)
                       &derefs_1.
                        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        .
                        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        ._M_impl._M_node._M_size,(TList<glslang::TIntermBinary_*> *)local_a8,
                       local_b0,0,local_50,0,-1,0,
                       (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_06,iVar5) + 8) &
                       0x7f,false);
            TList<glslang::TIntermBinary_*>::~TList((TList<glslang::TIntermBinary_*> *)local_a8);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&derefs_1.
                            super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                            .
                            super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                            ._M_impl._M_node._M_size);
        }
        TList<glslang::TIntermBinary_*>::TList((TList<glslang::TIntermBinary_*> *)&visitNode);
        local_e0 = (value_type)leftType;
        while (local_e0 != (value_type)0x0) {
          iVar4 = (*(local_e0->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          pTVar8 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0xf0))();
          bVar1 = isReflectionGranularity(this,pTVar8);
          if (!bVar1) {
            std::__cxx11::
            list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>::
            push_front((list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        *)&visitNode,&local_e0);
            local_e8 = local_e0;
            pVar10 = std::
                     set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
                     ::insert(&this->processedDerefs,(value_type *)&local_e8);
            local_f8 = (_Base_ptr)pVar10.first._M_node;
            local_f0 = pVar10.second;
          }
          iVar4 = (*(local_e0->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          local_e0 = (value_type)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x40))();
        }
        local_100 = local_30;
        std::
        set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
        ::insert(&this->processedDerefs,(value_type *)&local_100);
        baseName.field_2._12_4_ = 0;
        iVar4 = (*leftType->_vptr_TType[0x32])();
        pTVar8 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar4) + 0xf0))();
        bVar1 = isReflectionGranularity(this,pTVar8);
        if (bVar1) {
          iVar4 = (*leftType->_vptr_TType[0x32])();
          uVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x150))();
          if (((uVar9 & 1) != 0) &&
             (TVar6 = TIntermOperator::getOp((TIntermOperator *)leftType), TVar6 == EOpIndexDirect))
          {
            iVar4 = (*leftType->_vptr_TType[0x33])();
            this_00 = (TIntermConstantUnion *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x28))();
            this_01 = TIntermConstantUnion::getConstArray(this_00);
            this_02 = TConstUnionArray::operator[](this_01,0);
            iVar4 = TConstUnion::getIConst(this_02);
            baseName.field_2._12_4_ = iVar4 + 1;
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     local_140);
        if (blockName._7_1_ == false) {
          if (iVar2 == 0x10) {
            iVar2 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
            pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar2) + 0x28))();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_140,pbVar7);
          }
          else {
            iVar2 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)local_140,
                        (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_13,iVar2));
          }
        }
        iVar2 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        local_150._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>::
             begin((list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                    *)&visitNode);
        std::_List_const_iterator<glslang::TIntermBinary_*>::_List_const_iterator
                  (&local_148,&local_150);
        arraySize_00 = baseName.field_2._12_4_;
        iVar4 = (*(local_30->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        blowUpActiveAggregate
                  (this,(TType *)CONCAT44(extraout_var_14,iVar2),(TString *)local_140,
                   (TList<glslang::TIntermBinary_*> *)&visitNode,local_148,iStack_4c,local_50,
                   arraySize_00,-1,0,
                   (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_15,iVar4) + 8) & 0x7f,
                   true);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_140);
        TList<glslang::TIntermBinary_*>::~TList((TList<glslang::TIntermBinary_*> *)&visitNode);
      }
    }
  }
  return;
}

Assistant:

void addDereferencedUniform(TIntermBinary* topNode)
    {
        // See if too fine-grained to process (wait to get further down the tree)
        const TType& leftType = topNode->getLeft()->getType();
        if ((leftType.isVector() || leftType.isMatrix()) && ! leftType.isArray())
            return;

        // We have an array or structure or block dereference, see if it's a uniform
        // based dereference (if not, skip it).
        TIntermSymbol* base = findBase(topNode);
        if (! base || ! base->getQualifier().isUniformOrBuffer())
            return;

        // See if we've already processed this (e.g., in the middle of something
        // we did earlier), and if so skip it
        if (processedDerefs.find(topNode) != processedDerefs.end())
            return;

        // Process this uniform dereference

        int offset = -1;
        int blockIndex = -1;
        bool anonymous = false;

        // See if we need to record the block itself
        bool block = base->getBasicType() == EbtBlock;
        if (block) {
            offset = 0;
            anonymous = IsAnonymous(base->getName());

            const TString& blockName = base->getType().getTypeName();
            TString baseName;
            
            if (! anonymous)
                baseName = blockName;

            blockIndex = addBlockName(blockName, base->getType(), intermediate.getBlockSize(base->getType()));

            if (reflection.options & EShReflectionAllBlockVariables) {
                // Use a degenerate (empty) set of dereferences to immediately put as at the end of
                // the dereference change expected by blowUpActiveAggregate.
                TList<TIntermBinary*> derefs;

                // otherwise - if we're not using strict array suffix rules, or this isn't a block so we are
                // expanding root arrays anyway, just start the iteration from the base block type.
                blowUpActiveAggregate(base->getType(), baseName, derefs, derefs.end(), 0, blockIndex, 0, -1, 0,
                                          base->getQualifier().storage, false);
            }
        }

        // Process the dereference chain, backward, accumulating the pieces for later forward traversal.
        // If the topNode is a reflection-granularity-array dereference, don't include that last dereference.
        TList<TIntermBinary*> derefs;
        for (TIntermBinary* visitNode = topNode; visitNode; visitNode = visitNode->getLeft()->getAsBinaryNode()) {
            if (isReflectionGranularity(visitNode->getLeft()->getType()))
                continue;

            derefs.push_front(visitNode);
            processedDerefs.insert(visitNode);
        }
        processedDerefs.insert(base);

        // See if we have a specific array size to stick to while enumerating the explosion of the aggregate
        int arraySize = 0;
        if (isReflectionGranularity(topNode->getLeft()->getType()) && topNode->getLeft()->isArray()) {
            if (topNode->getOp() == EOpIndexDirect)
                arraySize = topNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst() + 1;
        }

        // Put the dereference chain together, forward
        TString baseName;
        if (! anonymous) {
            if (block)
                baseName = base->getType().getTypeName();
            else
                baseName = base->getName();
        }
        blowUpActiveAggregate(base->getType(), baseName, derefs, derefs.begin(), offset, blockIndex, arraySize, -1, 0,
                              base->getQualifier().storage, true);
    }